

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack22_32(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined4 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar15 [32];
  
  auVar7 = _DAT_00194510;
  auVar10 = *(undefined1 (*) [16])(in + 1);
  auVar29 = vpmovsxbd_avx(ZEXT416(0x1208140a));
  uVar1 = *(ulong *)(in + 5);
  auVar22._8_8_ = 0x1000000006;
  auVar22._0_8_ = 0x1000000006;
  auVar23._8_8_ = 0x3f0000003fffc0;
  auVar23._0_8_ = 0x3f0000003fffc0;
  uVar3 = *in;
  auVar5 = vpmovsxbd_avx(ZEXT416(0x8121c06));
  auVar8 = vpmovsxbd_avx512vl(ZEXT416(0x5010401));
  auVar26._8_8_ = 0xc00000002;
  auVar26._0_8_ = 0xc00000002;
  auVar27._8_8_ = 0x3ff000003ffffc;
  auVar27._0_8_ = 0x3ff000003ffffc;
  uVar2 = *(ulong *)(in + 0x10);
  *out = uVar3 & 0x3fffff;
  uVar4 = *(ulong *)(in + 9);
  auVar9 = vpsllvd_avx2(auVar10,auVar29);
  auVar9 = vpand_avx(auVar9,auVar7);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar1;
  auVar24 = vpsllvd_avx2(auVar20,auVar22);
  auVar24 = vpand_avx(auVar23,auVar24);
  auVar12 = vpmovsxbd_avx2(ZEXT816(0x3030201010008));
  auVar24 = vshufps_avx(auVar9,auVar24,0x47);
  auVar9 = vshufps_avx(auVar9,auVar9,0xa4);
  auVar18._16_16_ = auVar24;
  auVar18._0_16_ = auVar9;
  auVar11 = vpermt2d_avx512vl(ZEXT1632(auVar10),auVar12,ZEXT432(uVar3));
  uVar19 = (undefined4)uVar1;
  auVar14._4_4_ = uVar19;
  auVar14._0_4_ = uVar19;
  auVar14._8_4_ = uVar19;
  auVar14._12_4_ = uVar19;
  auVar14._16_4_ = uVar19;
  auVar14._20_4_ = uVar19;
  auVar14._24_4_ = uVar19;
  auVar14._28_4_ = uVar19;
  auVar11 = vpblendd_avx2(auVar11,auVar14,0x80);
  auVar14 = vpmovsxbd_avx2(ZEXT816(0x101a040e18020c16));
  auVar11 = vpsrlvd_avx2(auVar11,auVar14);
  auVar13._8_4_ = 0x3fffff;
  auVar13._0_8_ = 0x3fffff003fffff;
  auVar13._12_4_ = 0x3fffff;
  auVar15._16_4_ = 0x3fffff;
  auVar15._0_16_ = auVar13;
  auVar15._20_4_ = 0x3fffff;
  auVar15._24_4_ = 0x3fffff;
  auVar15._28_4_ = 0x3fffff;
  auVar18 = vpor_avx2(auVar11,auVar18);
  auVar11 = vpand_avx2(auVar11,auVar15);
  auVar24._8_8_ = 0x3fc000003ffff0;
  auVar24._0_8_ = 0x3fc000003ffff0;
  auVar11 = vpblendd_avx2(auVar18,auVar11,0x24);
  auVar9._8_8_ = 0xe00000004;
  auVar9._0_8_ = 0xe00000004;
  *(undefined1 (*) [32])(out + 1) = auVar11;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(in + 7);
  auVar24 = vpshufd_avx(auVar24,0x50);
  auVar6 = vpshufd_avx(auVar9,0x50);
  auVar10 = vshufps_avx(auVar20,auVar17,0x45);
  auVar9 = vshufps_avx(auVar17,auVar17,0x50);
  auVar16 = vpsrlvd_avx2(auVar10,auVar5);
  auVar9 = vpsllvd_avx2(auVar9,auVar6);
  auVar10 = vpand_avx(auVar16,auVar13);
  auVar9 = vpternlogd_avx512vl(auVar9,auVar16,auVar24,0xec);
  auVar10 = vpblendd_avx2(auVar10,auVar9,6);
  auVar25._8_8_ = 0x140000001e;
  auVar25._0_8_ = 0x140000001e;
  *(undefined1 (*) [16])(out + 9) = auVar10;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar4;
  auVar9 = vpermt2d_avx512vl(auVar17,auVar8,auVar21);
  auVar10 = vpsllvd_avx2(auVar21,auVar26);
  auVar9 = vpsrlvd_avx2(auVar9,auVar25);
  auVar9 = vpternlogd_avx512vl(auVar10,auVar9,auVar27,0xec);
  auVar10 = *(undefined1 (*) [16])(in + 0xc);
  *(long *)(out + 0xd) = auVar9._0_8_;
  out[0xf] = (uint)(uVar4 >> 0x2a);
  uVar3 = in[0xb];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar2;
  auVar9 = vpsllvd_avx512vl(auVar28,auVar22);
  auVar9 = vpand_avx(auVar23,auVar9);
  out[0x10] = uVar3 & 0x3fffff;
  uVar1 = *(ulong *)(in + 0x14);
  auVar11 = vpermi2d_avx512vl(auVar12,ZEXT1632(auVar10),ZEXT432(uVar3));
  auVar10 = vpsllvd_avx2(auVar10,auVar29);
  auVar12 = vpbroadcastd_avx512vl(auVar28);
  auVar10 = vpand_avx(auVar10,auVar7);
  auVar11 = vpblendd_avx2(auVar11,auVar12,0x80);
  auVar11 = vpsrlvd_avx2(auVar11,auVar14);
  auVar9 = vshufps_avx(auVar10,auVar9,0x47);
  auVar10 = vshufps_avx(auVar10,auVar10,0xa4);
  auVar12._16_16_ = auVar9;
  auVar12._0_16_ = auVar10;
  auVar12 = vpor_avx2(auVar11,auVar12);
  auVar11 = vpand_avx2(auVar11,auVar15);
  auVar11 = vpblendd_avx2(auVar12,auVar11,0x24);
  *(undefined1 (*) [32])(out + 0x11) = auVar11;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(in + 0x12);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar2;
  auVar9 = vshufps_avx512vl(auVar29,auVar16,0x45);
  auVar10 = vshufps_avx(auVar16,auVar16,0x50);
  auVar29 = vpsrlvd_avx2(auVar9,auVar5);
  auVar9 = vpsllvd_avx2(auVar10,auVar6);
  auVar10 = vpand_avx(auVar29,auVar13);
  auVar9 = vpternlogd_avx512vl(auVar9,auVar29,auVar24,0xec);
  auVar10 = vpblendd_avx2(auVar10,auVar9,6);
  *(undefined1 (*) [16])(out + 0x19) = auVar10;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1;
  auVar9 = vpermt2d_avx512vl(auVar16,auVar8,auVar10);
  auVar10 = vpsllvd_avx2(auVar10,auVar26);
  auVar9 = vpsrlvd_avx2(auVar9,auVar25);
  auVar10 = vpternlogd_avx512vl(auVar10,auVar9,auVar27,0xec);
  *(long *)(out + 0x1d) = auVar10._0_8_;
  out[0x1f] = (uint)(uVar1 >> 0x2a);
  return in + 0x16;
}

Assistant:

const uint32_t *__fastunpack22_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 12)) << (22 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 2)) << (22 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 22);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 14)) << (22 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 4)) << (22 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 22);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 16)) << (22 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 6)) << (22 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 22);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 18)) << (22 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 8)) << (22 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 22);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 20)) << (22 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 10)) << (22 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 12)) << (22 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 2)) << (22 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 22);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 14)) << (22 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 4)) << (22 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 22);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 16)) << (22 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 6)) << (22 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 22);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 18)) << (22 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 8)) << (22 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 22);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 20)) << (22 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 10)) << (22 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  out++;

  return in;
}